

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cc
# Opt level: O1

void SimpleScene(Stage *stage)

{
  Stage *this;
  vector<int,_std::allocator<int>_> uvIndices;
  vector<tinyusdz::value::texcoord2f,_std::allocator<tinyusdz::value::texcoord2f>_> uvs;
  PrimVar uvIndexVar;
  XformOp op;
  Prim xformPrim;
  vector<int,_std::allocator<int>_> counts;
  Prim meshPrim;
  double3 translate;
  Attribute uvIndexAttr;
  AttrMeta meta;
  Xform xform;
  GeomMesh mesh;
  vector<int,_std::allocator<int>_> local_7c38;
  vector<tinyusdz::value::texcoord2f,_std::allocator<tinyusdz::value::texcoord2f>_> local_7c18;
  Stage *local_7c00;
  storage_union local_7bf8;
  undefined1 *local_7be8;
  undefined1 local_7be0;
  undefined1 local_7bd8 [32];
  value_type local_7bb8;
  undefined1 local_7b48 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_7b38;
  Variability local_7b28;
  bool local_7b24;
  _Alloc_hider local_7b20;
  undefined1 local_7b18 [24];
  storage_union local_7b00;
  undefined1 *local_7af0;
  bool local_7ae8;
  undefined1 local_7ae0 [17];
  undefined8 uStack_7acf;
  undefined1 local_7ac0 [17];
  undefined1 auStack_7aaf [11];
  storage_t<tinyusdz::Interpolation> local_7aa4;
  bool local_7aa0;
  storage_t<unsigned_int> local_7a9c;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_7a98;
  undefined1 local_7a88 [48];
  bool local_7a58;
  undefined1 local_7a50 [40];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_7a28;
  storage_t<double> local_7a18;
  bool local_7a10;
  storage_t<tinyusdz::Token> local_7a08;
  undefined1 local_79e8 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_79c8;
  storage_t<tinyusdz::Token> local_79b8;
  undefined1 local_7998 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_7978;
  undefined8 uStack_7968;
  bool local_7960;
  storage_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_7958;
  undefined1 local_7938 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_7918;
  undefined1 local_7908 [40];
  undefined1 local_78e0 [40];
  pointer pSStack_78b8;
  storage_union local_78b0;
  vector<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_> local_7898 [34];
  undefined1 local_7568 [56];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_7530;
  storage_union sStack_7520;
  undefined1 *local_7510 [2];
  vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
  local_7500;
  undefined1 uStack_74e8;
  undefined7 uStack_74e7;
  undefined1 local_74e0 [17];
  undefined7 uStack_74cf;
  storage_t<tinyusdz::Token> sStack_74c8;
  undefined1 local_74a8 [48];
  undefined1 local_7478 [40];
  undefined1 local_7450 [56];
  undefined1 local_7418 [40];
  undefined1 local_73f0 [40];
  undefined1 local_73c8 [40];
  undefined8 local_73a0 [4];
  size_t local_7380;
  storage_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  sStack_7378;
  bool local_7358;
  storage_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_7350;
  bool local_7330;
  storage_t<tinyusdz::Token> local_7328;
  _Rb_tree_node_base local_7300;
  size_t local_72e0;
  pointer pSStack_72d8;
  pointer local_72d0;
  pointer pSStack_72c8;
  undefined1 local_72b8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_72a8;
  vector<tinyusdz::TypedTimeSamples<std::vector<int,_std::allocator<int>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::vector<int,_std::allocator<int>_>_>::Sample>_>
  local_7298 [61];
  array<double,_3UL> local_6cd8;
  storage_union local_6cc0;
  undefined1 *local_6cb0;
  undefined1 local_6ca8;
  vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
  local_6ca0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_6c88;
  storage_union local_6c78;
  undefined1 *local_6c68;
  undefined1 local_6c60;
  undefined1 local_6c58 [32];
  undefined1 local_6c38 [24];
  AttrMetas AStack_6c20;
  AttrMetas local_6a18;
  GPrim local_6810;
  undefined1 local_49a8 [8336];
  optional<tinyusdz::Animatable<std::vector<tinyusdz::value::point3f,std::allocator<tinyusdz::value::point3f>>>>
  local_2918 [1896];
  optional<tinyusdz::Animatable<std::vector<int,std::allocator<int>>>> local_21b0 [632];
  optional<tinyusdz::Animatable<std::vector<int,std::allocator<int>>>> local_1f38 [7944];
  
  tinyusdz::GPrim::GPrim(&local_6810);
  std::__cxx11::string::_M_replace
            ((ulong)&local_6810.name,0,(char *)local_6810.name._M_string_length,0x1d6020);
  local_7bb8.suffix._M_dataplus._M_p = (pointer)&local_7bb8.suffix.field_2;
  local_7bb8.inverted = false;
  local_7bb8.suffix._M_string_length = 0;
  local_7bb8.suffix.field_2._M_local_buf[0] = '\0';
  local_7bb8._var._value.v_.vtable =
       (vtable_type *)linb::any::vtable_for_type<decltype(nullptr)>()::table;
  local_7bb8._var._value.v_.storage.dynamic = (void *)0x0;
  local_7bb8._var._blocked = false;
  local_7bb8._var._ts._samples.
  super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_7bb8._var._ts._samples.
  super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
  ._M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
  local_7bb8._var._ts._samples.
  super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
  ._M_impl.super__Vector_impl_data._M_finish._1_7_ = 0;
  local_7bb8._var._ts._samples.
  super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
  local_7bb8._var._ts._17_8_ = 0;
  local_7bb8._is_blocked = false;
  local_7bb8.op_type = Translate;
  local_6cd8._M_elems[0] = 1.0;
  local_6cd8._M_elems[1] = 2.0;
  local_6cd8._M_elems[2] = 3.0;
  linb::any::operator=((any *)&local_7bb8._var,&local_6cd8);
  std::vector<tinyusdz::XformOp,_std::allocator<tinyusdz::XformOp>_>::push_back
            ((vector<tinyusdz::XformOp,_std::allocator<tinyusdz::XformOp>_> *)&local_6810,
             &local_7bb8);
  tinyusdz::GeomMesh::GeomMesh((GeomMesh *)local_49a8);
  std::__cxx11::string::_M_replace
            ((ulong)(local_49a8 + 0xa78),0,(char *)local_49a8._2688_8_,0x1d6025);
  local_7b48._0_8_ = (pointer)0x0;
  local_7b48._8_8_ = (point3f *)0x0;
  local_7b38._M_allocated_capacity = 0;
  local_72b8._0_4_ = 0.0;
  local_72b8._4_4_ = 0.0;
  local_72b8._8_4_ = 0.0;
  std::vector<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_>::
  _M_realloc_insert<tinyusdz::value::point3f>
            ((vector<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_> *)
             local_7b48,(iterator)0x0,(point3f *)local_72b8);
  local_72b8._0_4_ = 1.0;
  local_72b8._4_4_ = 0.0;
  local_72b8._8_4_ = 0.0;
  if (local_7b48._8_8_ == local_7b38._M_allocated_capacity) {
    std::vector<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_>::
    _M_realloc_insert<tinyusdz::value::point3f>
              ((vector<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_> *)
               local_7b48,(iterator)local_7b48._8_8_,(point3f *)local_72b8);
  }
  else {
    *(float *)(local_7b48._8_8_ + 8) = 0.0;
    *(undefined8 *)local_7b48._8_8_ = 0x3f800000;
    local_7b48._8_8_ = local_7b48._8_8_ + 0xc;
  }
  local_72b8._0_4_ = 1.0;
  local_72b8._4_4_ = 1.0;
  local_72b8._8_4_ = 0.0;
  if (local_7b48._8_8_ == local_7b38._M_allocated_capacity) {
    std::vector<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_>::
    _M_realloc_insert<tinyusdz::value::point3f>
              ((vector<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_> *)
               local_7b48,(iterator)local_7b48._8_8_,(point3f *)local_72b8);
  }
  else {
    *(float *)(local_7b48._8_8_ + 8) = 0.0;
    *(undefined8 *)local_7b48._8_8_ = 0x3f8000003f800000;
    local_7b48._8_8_ = local_7b48._8_8_ + 0xc;
  }
  local_72b8._0_4_ = 0.0;
  local_72b8._4_4_ = 1.0;
  local_72b8._8_4_ = 0.0;
  if (local_7b48._8_8_ == local_7b38._M_allocated_capacity) {
    std::vector<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_>::
    _M_realloc_insert<tinyusdz::value::point3f>
              ((vector<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_> *)
               local_7b48,(iterator)local_7b48._8_8_,(point3f *)local_72b8);
  }
  else {
    *(float *)(local_7b48._8_8_ + 8) = 0.0;
    *(undefined8 *)local_7b48._8_8_ = 0x3f80000000000000;
    local_7b48._8_8_ = local_7b48._8_8_ + 0xc;
  }
  tinyusdz::
  Animatable<std::vector<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_>_>::
  Animatable((Animatable<std::vector<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_>_>
              *)local_72b8,
             (vector<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_> *)
             local_7b48);
  nonstd::optional_lite::
  optional<tinyusdz::Animatable<std::vector<tinyusdz::value::point3f,std::allocator<tinyusdz::value::point3f>>>>
  ::operator=(local_2918,
              (Animatable<std::vector<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_>_>
               *)local_72b8);
  std::
  vector<tinyusdz::TypedTimeSamples<std::vector<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::vector<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_>_>::Sample>_>
  ::~vector((vector<tinyusdz::TypedTimeSamples<std::vector<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::vector<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_>_>::Sample>_>
             *)local_7298);
  if ((texcoord2f)local_72b8._0_8_ != (texcoord2f)0x0) {
    operator_delete((void *)local_72b8._0_8_,local_72a8._M_allocated_capacity - local_72b8._0_8_);
  }
  if ((pointer)local_7b48._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_7b48._0_8_,local_7b38._M_allocated_capacity - local_7b48._0_8_);
  }
  local_7b38._M_allocated_capacity = 0;
  local_7b48._0_8_ = (pointer)0x0;
  local_7b48._8_8_ = (pointer)0x0;
  local_7568._16_8_ = (int *)0x0;
  local_7568[0] = false;
  local_7568._1_3_ = 0;
  local_7568._4_4_ = (storage_t<tinyusdz::Interpolation>)0x0;
  local_7568[8] = false;
  local_7568._9_3_ = 0;
  local_7568._12_4_ = (storage_t<unsigned_int>)0x0;
  local_72b8._0_4_ = 4.2039e-45;
  std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
            ((vector<int,_std::allocator<int>_> *)local_7568,(iterator)0x0,(int *)local_72b8);
  local_72b8._0_4_ = 4.2039e-45;
  if (local_7568._8_8_ == local_7568._16_8_) {
    std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
              ((vector<int,_std::allocator<int>_> *)local_7568,(iterator)local_7568._8_8_,
               (int *)local_72b8);
  }
  else {
    *(int *)local_7568._8_8_ = 3;
    local_7568._8_8_ = local_7568._8_8_ + 4;
  }
  tinyusdz::Animatable<std::vector<int,_std::allocator<int>_>_>::Animatable
            ((Animatable<std::vector<int,_std::allocator<int>_>_> *)local_72b8,
             (vector<int,_std::allocator<int>_> *)local_7568);
  nonstd::optional_lite::optional<tinyusdz::Animatable<std::vector<int,std::allocator<int>>>>::
  operator=(local_21b0,(Animatable<std::vector<int,_std::allocator<int>_>_> *)local_72b8);
  std::
  vector<tinyusdz::TypedTimeSamples<std::vector<int,_std::allocator<int>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::vector<int,_std::allocator<int>_>_>::Sample>_>
  ::~vector(local_7298);
  if ((texcoord2f)local_72b8._0_8_ != (texcoord2f)0x0) {
    operator_delete((void *)local_72b8._0_8_,local_72a8._M_allocated_capacity - local_72b8._0_8_);
  }
  local_72b8._0_8_ = local_72b8._0_8_ & 0xffffffff00000000;
  if (local_7b48._8_8_ == local_7b38._M_allocated_capacity) {
    std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
              ((vector<int,_std::allocator<int>_> *)local_7b48,(iterator)local_7b48._8_8_,
               (int *)local_72b8);
  }
  else {
    *(int *)local_7b48._8_8_ = 0;
    local_7b48._8_8_ = local_7b48._8_8_ + 4;
  }
  local_72b8._0_4_ = 1.4013e-45;
  if (local_7b48._8_8_ == local_7b38._M_allocated_capacity) {
    std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
              ((vector<int,_std::allocator<int>_> *)local_7b48,(iterator)local_7b48._8_8_,
               (int *)local_72b8);
  }
  else {
    *(int *)local_7b48._8_8_ = 1;
    local_7b48._8_8_ = local_7b48._8_8_ + 4;
  }
  local_72b8._0_4_ = 2.8026e-45;
  if (local_7b48._8_8_ == local_7b38._M_allocated_capacity) {
    std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
              ((vector<int,_std::allocator<int>_> *)local_7b48,(iterator)local_7b48._8_8_,
               (int *)local_72b8);
  }
  else {
    *(int *)local_7b48._8_8_ = 2;
    local_7b48._8_8_ = local_7b48._8_8_ + 4;
  }
  local_72b8._0_4_ = 0.0;
  if (local_7b48._8_8_ == local_7b38._M_allocated_capacity) {
    std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
              ((vector<int,_std::allocator<int>_> *)local_7b48,(iterator)local_7b48._8_8_,
               (int *)local_72b8);
  }
  else {
    *(int *)local_7b48._8_8_ = 0;
    local_7b48._8_8_ = local_7b48._8_8_ + 4;
  }
  local_72b8._0_4_ = 2.8026e-45;
  if (local_7b48._8_8_ == local_7b38._M_allocated_capacity) {
    std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
              ((vector<int,_std::allocator<int>_> *)local_7b48,(iterator)local_7b48._8_8_,
               (int *)local_72b8);
  }
  else {
    *(int *)local_7b48._8_8_ = 2;
    local_7b48._8_8_ = local_7b48._8_8_ + 4;
  }
  local_72b8._0_4_ = 4.2039e-45;
  if (local_7b48._8_8_ == local_7b38._M_allocated_capacity) {
    std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
              ((vector<int,_std::allocator<int>_> *)local_7b48,(iterator)local_7b48._8_8_,
               (int *)local_72b8);
  }
  else {
    *(int *)local_7b48._8_8_ = 3;
    local_7b48._8_8_ = local_7b48._8_8_ + 4;
  }
  tinyusdz::Animatable<std::vector<int,_std::allocator<int>_>_>::Animatable
            ((Animatable<std::vector<int,_std::allocator<int>_>_> *)local_72b8,
             (vector<int,_std::allocator<int>_> *)local_7b48);
  nonstd::optional_lite::optional<tinyusdz::Animatable<std::vector<int,std::allocator<int>>>>::
  operator=(local_1f38,(Animatable<std::vector<int,_std::allocator<int>_>_> *)local_72b8);
  std::
  vector<tinyusdz::TypedTimeSamples<std::vector<int,_std::allocator<int>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::vector<int,_std::allocator<int>_>_>::Sample>_>
  ::~vector(local_7298);
  if ((texcoord2f)local_72b8._0_8_ != (texcoord2f)0x0) {
    operator_delete((void *)local_72b8._0_8_,local_72a8._M_allocated_capacity - local_72b8._0_8_);
  }
  if ((optional<tinyusdz::Interpolation>)local_7568._0_8_ != (optional<tinyusdz::Interpolation>)0x0)
  {
    operator_delete((void *)local_7568._0_8_,local_7568._16_8_ - local_7568._0_8_);
  }
  if ((pointer)local_7b48._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_7b48._0_8_,local_7b38._M_allocated_capacity - local_7b48._0_8_);
  }
  local_7568._0_8_ = (long)local_7568 + 0x10;
  local_7568[8] = false;
  local_7568._9_3_ = 0;
  local_7568._12_4_ = (storage_t<unsigned_int>)0x0;
  local_7568._16_8_ = local_7568._16_8_ & 0xffffffffffffff00;
  local_7568._32_8_ = (ulong)(uint3)local_7568._37_3_ << 0x28;
  local_7568._48_8_ = 0;
  aStack_7530._M_allocated_capacity = aStack_7530._M_allocated_capacity & 0xffffffffffffff00;
  local_7510[0] = linb::any::vtable_for_type<decltype(nullptr)>()::table;
  sStack_7520.dynamic = (void *)0x0;
  local_7510[1] = (undefined1 *)((ulong)local_7510[1] & 0xffffffffffffff00);
  local_7500.
  super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_7500.
  super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
  ._M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
  local_7500.
  super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
  ._M_impl.super__Vector_impl_data._M_finish._1_7_ = 0;
  local_7500.
  super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
  local_7500.
  super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._1_7_ = 0;
  uStack_74e8 = false;
  sStack_74c8._4_4_ = (storage_t<tinyusdz::Interpolation>)0x0;
  sStack_74c8._8_8_ = ((ulong)sStack_74c8._8_8_ >> 8 & 0xffffff) << 8;
  sStack_74c8._16_8_ = sStack_74c8._16_8_ & 0xffffffffffff0000;
  sStack_74c8._24_8_ = sStack_74c8._24_8_ & 0xffffffffffffff00;
  local_7450._24_8_ = (storage_t<double>)0x0;
  local_7450._32_8_ = local_7450._32_8_ & 0xffffffffffffff00;
  local_7328._16_8_ = 0;
  local_7328._24_8_ = 0;
  local_7328.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
  local_7328._8_8_ = 0;
  local_7300._M_left = &local_7300;
  local_7300._M_color = _S_red;
  local_7300._M_parent = (_Base_ptr)0x0;
  local_74a8._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
  local_74a8._8_8_ = (anon_struct_8_0_00000001_for___align)0x0;
  local_74a8._16_8_ = 0;
  local_74a8._24_8_ = 0;
  local_74a8._32_8_ = 0;
  local_74a8._40_8_ = 0;
  local_7478._0_8_ = local_7478._0_8_ & 0xffffffffffffff00;
  local_7478._8_8_ = (anon_struct_8_0_00000001_for___align)0x0;
  local_7478._16_8_ = 0;
  local_7478._24_8_ = 0;
  local_7478._32_8_ = 0;
  local_7450._0_8_ = 0;
  local_7450._8_8_ = 0;
  local_7450._16_8_ = local_7450._16_8_ & 0xffffffffffffff00;
  local_7450._40_8_ = (anon_struct_8_0_00000001_for___align)0x0;
  local_7450._48_8_ = 0;
  local_7418._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
  local_7418._8_8_ = 0;
  local_7418._16_8_ = local_7418._16_8_ & 0xffffffffffffff00;
  local_7418._24_8_ = (anon_struct_8_0_00000001_for___align)0x0;
  local_7418._32_8_ = 0;
  local_73f0._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
  local_73f0._8_8_ = 0;
  local_73f0._16_8_ = local_73f0._16_8_ & 0xffffffffffffff00;
  local_73c8._16_8_ = local_73c8._16_8_ & 0xffffffffffffff00;
  local_73c8._0_8_ = 0;
  local_73c8._8_8_ = 0;
  local_73f0._24_8_ = (anon_struct_8_0_00000001_for___align)0x0;
  local_73f0._32_8_ = 0;
  local_7380 = local_7380 & 0xffffffffffffff00;
  local_73a0[2] = 0;
  local_73a0[3] = 0;
  local_73a0[0] = 0;
  local_73a0[1] = 0;
  local_73c8._24_8_ = (anon_struct_8_0_00000001_for___align)0x0;
  local_73c8._32_8_ = 0;
  local_7358 = false;
  sStack_7378._16_8_ = 0;
  sStack_7378._24_8_ = 0;
  sStack_7378.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
  sStack_7378._8_8_ = 0;
  local_7330 = false;
  local_7350._16_8_ = 0;
  local_7350._24_8_ = 0;
  local_7350.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
  local_7350._8_8_ = 0;
  local_74e0[0x10] = false;
  uStack_74cf = 0;
  sStack_74c8._0_4_ = sStack_74c8._0_4_ & 0xffffff00;
  local_74e0._0_8_ = (pointer)0x0;
  local_74e0[8] = 0;
  local_74e0._9_7_ = 0;
  local_72e0 = 0;
  pSStack_72d8 = (pointer)0x0;
  local_72d0 = (pointer)0x0;
  pSStack_72c8 = (pointer)0x0;
  local_7c18.
  super__Vector_base<tinyusdz::value::texcoord2f,_std::allocator<tinyusdz::value::texcoord2f>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (texcoord2f *)0x0;
  local_7c18.
  super__Vector_base<tinyusdz::value::texcoord2f,_std::allocator<tinyusdz::value::texcoord2f>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_7c18.
  super__Vector_base<tinyusdz::value::texcoord2f,_std::allocator<tinyusdz::value::texcoord2f>_>.
  _M_impl.super__Vector_impl_data._M_finish = (texcoord2f *)0x0;
  local_72b8._0_4_ = 0.0;
  local_72b8._4_4_ = 0.0;
  local_7568._40_8_ = &aStack_7530;
  local_7300._M_right = local_7300._M_left;
  std::vector<tinyusdz::value::texcoord2f,_std::allocator<tinyusdz::value::texcoord2f>_>::
  _M_realloc_insert<tinyusdz::value::texcoord2f>(&local_7c18,(iterator)0x0,(texcoord2f *)local_72b8)
  ;
  local_72b8._0_4_ = 1.0;
  local_72b8._4_4_ = 0.0;
  if (local_7c18.
      super__Vector_base<tinyusdz::value::texcoord2f,_std::allocator<tinyusdz::value::texcoord2f>_>.
      _M_impl.super__Vector_impl_data._M_finish ==
      local_7c18.
      super__Vector_base<tinyusdz::value::texcoord2f,_std::allocator<tinyusdz::value::texcoord2f>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<tinyusdz::value::texcoord2f,_std::allocator<tinyusdz::value::texcoord2f>_>::
    _M_realloc_insert<tinyusdz::value::texcoord2f>
              (&local_7c18,
               (iterator)
               local_7c18.
               super__Vector_base<tinyusdz::value::texcoord2f,_std::allocator<tinyusdz::value::texcoord2f>_>
               ._M_impl.super__Vector_impl_data._M_finish,(texcoord2f *)local_72b8);
  }
  else {
    (local_7c18.
     super__Vector_base<tinyusdz::value::texcoord2f,_std::allocator<tinyusdz::value::texcoord2f>_>.
     _M_impl.super__Vector_impl_data._M_finish)->s = 1.0;
    (local_7c18.
     super__Vector_base<tinyusdz::value::texcoord2f,_std::allocator<tinyusdz::value::texcoord2f>_>.
     _M_impl.super__Vector_impl_data._M_finish)->t = 0.0;
    local_7c18.
    super__Vector_base<tinyusdz::value::texcoord2f,_std::allocator<tinyusdz::value::texcoord2f>_>.
    _M_impl.super__Vector_impl_data._M_finish =
         local_7c18.
         super__Vector_base<tinyusdz::value::texcoord2f,_std::allocator<tinyusdz::value::texcoord2f>_>
         ._M_impl.super__Vector_impl_data._M_finish + 1;
  }
  local_72b8._0_4_ = 1.0;
  local_72b8._4_4_ = 1.0;
  if (local_7c18.
      super__Vector_base<tinyusdz::value::texcoord2f,_std::allocator<tinyusdz::value::texcoord2f>_>.
      _M_impl.super__Vector_impl_data._M_finish ==
      local_7c18.
      super__Vector_base<tinyusdz::value::texcoord2f,_std::allocator<tinyusdz::value::texcoord2f>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<tinyusdz::value::texcoord2f,_std::allocator<tinyusdz::value::texcoord2f>_>::
    _M_realloc_insert<tinyusdz::value::texcoord2f>
              (&local_7c18,
               (iterator)
               local_7c18.
               super__Vector_base<tinyusdz::value::texcoord2f,_std::allocator<tinyusdz::value::texcoord2f>_>
               ._M_impl.super__Vector_impl_data._M_finish,(texcoord2f *)local_72b8);
  }
  else {
    (local_7c18.
     super__Vector_base<tinyusdz::value::texcoord2f,_std::allocator<tinyusdz::value::texcoord2f>_>.
     _M_impl.super__Vector_impl_data._M_finish)->s = 1.0;
    (local_7c18.
     super__Vector_base<tinyusdz::value::texcoord2f,_std::allocator<tinyusdz::value::texcoord2f>_>.
     _M_impl.super__Vector_impl_data._M_finish)->t = 1.0;
    local_7c18.
    super__Vector_base<tinyusdz::value::texcoord2f,_std::allocator<tinyusdz::value::texcoord2f>_>.
    _M_impl.super__Vector_impl_data._M_finish =
         local_7c18.
         super__Vector_base<tinyusdz::value::texcoord2f,_std::allocator<tinyusdz::value::texcoord2f>_>
         ._M_impl.super__Vector_impl_data._M_finish + 1;
  }
  local_72b8._0_4_ = 0.0;
  local_72b8._4_4_ = 1.0;
  if (local_7c18.
      super__Vector_base<tinyusdz::value::texcoord2f,_std::allocator<tinyusdz::value::texcoord2f>_>.
      _M_impl.super__Vector_impl_data._M_finish ==
      local_7c18.
      super__Vector_base<tinyusdz::value::texcoord2f,_std::allocator<tinyusdz::value::texcoord2f>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<tinyusdz::value::texcoord2f,_std::allocator<tinyusdz::value::texcoord2f>_>::
    _M_realloc_insert<tinyusdz::value::texcoord2f>
              (&local_7c18,
               (iterator)
               local_7c18.
               super__Vector_base<tinyusdz::value::texcoord2f,_std::allocator<tinyusdz::value::texcoord2f>_>
               ._M_impl.super__Vector_impl_data._M_finish,(texcoord2f *)local_72b8);
  }
  else {
    (local_7c18.
     super__Vector_base<tinyusdz::value::texcoord2f,_std::allocator<tinyusdz::value::texcoord2f>_>.
     _M_impl.super__Vector_impl_data._M_finish)->s = 0.0;
    (local_7c18.
     super__Vector_base<tinyusdz::value::texcoord2f,_std::allocator<tinyusdz::value::texcoord2f>_>.
     _M_impl.super__Vector_impl_data._M_finish)->t = 1.0;
    local_7c18.
    super__Vector_base<tinyusdz::value::texcoord2f,_std::allocator<tinyusdz::value::texcoord2f>_>.
    _M_impl.super__Vector_impl_data._M_finish =
         local_7c18.
         super__Vector_base<tinyusdz::value::texcoord2f,_std::allocator<tinyusdz::value::texcoord2f>_>
         ._M_impl.super__Vector_impl_data._M_finish + 1;
  }
  tinyusdz::Attribute::
  set_value<std::vector<tinyusdz::value::texcoord2f,std::allocator<tinyusdz::value::texcoord2f>>>
            ((Attribute *)local_7568,&local_7c18);
  local_6a18.meta._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_6a18.meta._M_t._M_impl.super__Rb_tree_header._M_header;
  local_6a18.interpolation._0_4_ = local_6a18.interpolation._0_4_ & 0xffffff00;
  local_6a18.elementSize.has_value_ = false;
  local_6a18.elementSize.contained = (storage_t<unsigned_int>)0x0;
  local_6a18.hidden.has_value_ = false;
  local_6a18.hidden.contained = (storage_t<bool>)0x0;
  local_6a18.comment.has_value_ = false;
  local_6a18.weight.contained = (storage_t<double>)0x0;
  local_6a18.connectability.has_value_ = false;
  local_6a18.bindMaterialAs.contained.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
  local_6a18.bindMaterialAs.contained._8_8_ = 0;
  local_6a18.bindMaterialAs.contained._16_8_ = 0;
  local_6a18.bindMaterialAs.contained._24_8_ = 0;
  local_6a18.meta._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_6a18.meta._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_6a18.comment.contained.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
  local_6a18.comment.contained._8_8_ = 0;
  local_6a18.comment.contained._16_8_ = 0;
  local_6a18.comment.contained._24_8_ = 0;
  local_6a18.comment.contained._32_8_ = 0;
  local_6a18.comment.contained._40_8_ = 0;
  local_6a18.customData.has_value_ = false;
  local_6a18.customData.contained.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
  local_6a18.customData.contained._8_8_ = 0;
  local_6a18.customData.contained._16_8_ = 0;
  local_6a18.customData.contained._24_8_ = 0;
  local_6a18.customData.contained._32_8_ = 0;
  local_6a18.customData.contained._40_8_ = 0;
  local_6a18.weight.has_value_ = false;
  local_6a18.outputName.has_value_ = false;
  local_6a18.connectability.contained._16_8_ = 0;
  local_6a18.connectability.contained._24_8_ = 0;
  local_6a18.connectability.contained.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
  local_6a18.connectability.contained._8_8_ = 0;
  local_6a18.renderType.has_value_ = false;
  local_6a18.outputName.contained._16_8_ = 0;
  local_6a18.outputName.contained._24_8_ = 0;
  local_6a18.outputName.contained.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
  local_6a18.outputName.contained._8_8_ = 0;
  local_6a18.sdrMetadata.has_value_ = false;
  local_6a18.renderType.contained._16_8_ = 0;
  local_6a18.renderType.contained._24_8_ = 0;
  local_6a18.renderType.contained.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
  local_6a18.renderType.contained._8_8_ = 0;
  local_6a18.displayName.has_value_ = false;
  local_6a18.sdrMetadata.contained._32_8_ = 0;
  local_6a18.sdrMetadata.contained._40_8_ = 0;
  local_6a18.sdrMetadata.contained._16_8_ = 0;
  local_6a18.sdrMetadata.contained._24_8_ = 0;
  local_6a18.sdrMetadata.contained.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
  local_6a18.sdrMetadata.contained._8_8_ = 0;
  local_6a18.displayGroup.has_value_ = false;
  local_6a18.displayName.contained._16_8_ = 0;
  local_6a18.displayName.contained._24_8_ = 0;
  local_6a18.displayName.contained.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
  local_6a18.displayName.contained._8_8_ = 0;
  local_6a18.displayGroup.contained.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
  local_6a18.displayGroup.contained._8_8_ = 0;
  local_6a18.displayGroup.contained._16_8_ = 0;
  local_6a18.displayGroup.contained._24_8_ = 0;
  local_6a18.bindMaterialAs.has_value_ = false;
  local_6a18.stringData.
  super__Vector_base<tinyusdz::value::StringData,_std::allocator<tinyusdz::value::StringData>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_6a18.stringData.
  super__Vector_base<tinyusdz::value::StringData,_std::allocator<tinyusdz::value::StringData>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_6a18.meta._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_6a18.stringData.
  super__Vector_base<tinyusdz::value::StringData,_std::allocator<tinyusdz::value::StringData>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_6a18.interpolation.contained = (storage_t<tinyusdz::Interpolation>)0x3;
  local_6a18.interpolation.has_value_ = true;
  local_6a18.meta._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       local_6a18.meta._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  tinyusdz::AttrMetas::operator=((AttrMetas *)&sStack_74c8,&local_6a18);
  tinyusdz::Property::Property((Property *)local_72b8,(Attribute *)local_7568,false);
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,tinyusdz::Property>,std::_Select1st<std::pair<std::__cxx11::string_const,tinyusdz::Property>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,tinyusdz::Property>>>
  ::_M_emplace_unique<char_const(&)[12],tinyusdz::Property&>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,tinyusdz::Property>,std::_Select1st<std::pair<std::__cxx11::string_const,tinyusdz::Property>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,tinyusdz::Property>>>
              *)(local_49a8 + 0x1970),(char (*) [12])"primvars:uv",(Property *)local_72b8);
  local_6cc0.dynamic = &local_6cb0;
  local_6cc0._8_8_ = 0;
  local_6cb0 = (undefined1 *)((ulong)local_6cb0 & 0xffffffffffffff00);
  local_6ca0.
  super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (pointer)((ulong)local_6ca0.
                        super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                        ._M_impl.super__Vector_impl_data._M_start._5_3_ << 0x28);
  local_6ca0.
  super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
  ._M_impl.super__Vector_impl_data._M_finish._0_1_ = SUB81(&local_6c88,0);
  local_6ca0.
  super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
  ._M_impl.super__Vector_impl_data._M_finish._1_7_ = (undefined7)((ulong)&local_6c88 >> 8);
  local_6ca0.
  super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
  local_6ca0.
  super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._1_7_ = 0;
  local_6c88._M_local_buf[0] = '\0';
  local_6c68 = linb::any::vtable_for_type<decltype(nullptr)>()::table;
  local_6c78.dynamic = (void *)0x0;
  local_6c60 = 0;
  local_6c58._0_8_ = (pointer)0x0;
  local_6c58[8] = 0;
  local_6c58._9_7_ = 0;
  local_6c58[0x10] = 0;
  local_6c58._17_8_ = 0;
  AStack_6c20.interpolation.contained = (storage_t<tinyusdz::Interpolation>)0x0;
  AStack_6c20.elementSize.has_value_ = false;
  AStack_6c20.elementSize.contained = (storage_t<unsigned_int>)0x0;
  AStack_6c20.hidden.has_value_ = false;
  AStack_6c20.hidden.contained = (storage_t<bool>)0x0;
  AStack_6c20.comment.has_value_ = false;
  AStack_6c20.weight.contained = (storage_t<double>)0x0;
  AStack_6c20.connectability.has_value_ = false;
  AStack_6c20.bindMaterialAs.contained._16_8_ = 0;
  AStack_6c20.bindMaterialAs.contained._24_8_ = 0;
  AStack_6c20.bindMaterialAs.contained.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
  AStack_6c20.bindMaterialAs.contained._8_8_ = 0;
  AStack_6c20.meta._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &AStack_6c20.meta._M_t._M_impl.super__Rb_tree_header._M_header;
  AStack_6c20.meta._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  AStack_6c20.meta._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  AStack_6c20.comment.contained.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
  AStack_6c20.comment.contained._8_8_ = 0;
  AStack_6c20.comment.contained._16_8_ = 0;
  AStack_6c20.comment.contained._24_8_ = 0;
  AStack_6c20.comment.contained._32_8_ = 0;
  AStack_6c20.comment.contained._40_8_ = 0;
  AStack_6c20.customData.has_value_ = false;
  AStack_6c20.customData.contained.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
  AStack_6c20.customData.contained._8_8_ = 0;
  AStack_6c20.customData.contained._16_8_ = 0;
  AStack_6c20.customData.contained._24_8_ = 0;
  AStack_6c20.customData.contained._32_8_ = 0;
  AStack_6c20.customData.contained._40_8_ = 0;
  AStack_6c20.weight.has_value_ = false;
  AStack_6c20.connectability.contained.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
  AStack_6c20.connectability.contained._8_8_ = 0;
  AStack_6c20.connectability.contained._16_8_ = 0;
  AStack_6c20.connectability.contained._24_8_ = 0;
  AStack_6c20.outputName.has_value_ = false;
  AStack_6c20.outputName.contained.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
  AStack_6c20.outputName.contained._8_8_ = 0;
  AStack_6c20.outputName.contained._16_8_ = 0;
  AStack_6c20.outputName.contained._24_8_ = 0;
  AStack_6c20.renderType.has_value_ = false;
  AStack_6c20.sdrMetadata.has_value_ = false;
  AStack_6c20.renderType.contained._16_8_ = 0;
  AStack_6c20.renderType.contained._24_8_ = 0;
  AStack_6c20.renderType.contained.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
  AStack_6c20.renderType.contained._8_8_ = 0;
  AStack_6c20.displayName.has_value_ = false;
  AStack_6c20.sdrMetadata.contained._32_8_ = 0;
  AStack_6c20.sdrMetadata.contained._40_8_ = 0;
  AStack_6c20.sdrMetadata.contained._16_8_ = 0;
  AStack_6c20.sdrMetadata.contained._24_8_ = 0;
  AStack_6c20.sdrMetadata.contained.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
  AStack_6c20.sdrMetadata.contained._8_8_ = 0;
  AStack_6c20.displayGroup.has_value_ = false;
  AStack_6c20.displayName.contained._16_8_ = 0;
  AStack_6c20.displayName.contained._24_8_ = 0;
  AStack_6c20.displayName.contained.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
  AStack_6c20.displayName.contained._8_8_ = 0;
  AStack_6c20.bindMaterialAs.has_value_ = false;
  AStack_6c20.displayGroup.contained._16_8_ = 0;
  AStack_6c20.displayGroup.contained._24_8_ = 0;
  AStack_6c20.displayGroup.contained.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
  AStack_6c20.displayGroup.contained._8_8_ = 0;
  local_6c38[0x10] = 0;
  stack0xffffffffffff93d9 = 0;
  local_6c38._0_8_ = (pointer)0x0;
  local_6c38[8] = 0;
  local_6c38._9_7_ = 0;
  AStack_6c20.meta._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  AStack_6c20.stringData.
  super__Vector_base<tinyusdz::value::StringData,_std::allocator<tinyusdz::value::StringData>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  AStack_6c20.stringData.
  super__Vector_base<tinyusdz::value::StringData,_std::allocator<tinyusdz::value::StringData>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  AStack_6c20.stringData.
  super__Vector_base<tinyusdz::value::StringData,_std::allocator<tinyusdz::value::StringData>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_7c38.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (int *)0x0;
  local_7c38.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x0;
  local_7c38.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
       = (int *)0x0;
  local_7b48._0_8_ = local_7b48._0_8_ & 0xffffffff00000000;
  AStack_6c20.meta._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       AStack_6c20.meta._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
            (&local_7c38,(iterator)0x0,(int *)local_7b48);
  local_7b48._0_4_ = 1;
  if (local_7c38.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish ==
      local_7c38.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage) {
    std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
              (&local_7c38,
               (iterator)
               local_7c38.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish,(int *)local_7b48);
  }
  else {
    *local_7c38.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
     _M_finish = 1;
    local_7c38.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = local_7c38.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish + 1;
  }
  local_7b48._0_4_ = 2;
  if (local_7c38.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish ==
      local_7c38.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage) {
    std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
              (&local_7c38,
               (iterator)
               local_7c38.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish,(int *)local_7b48);
  }
  else {
    *local_7c38.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
     _M_finish = 2;
    local_7c38.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = local_7c38.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish + 1;
  }
  local_7b48._0_4_ = 3;
  if (local_7c38.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish ==
      local_7c38.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage) {
    std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
              (&local_7c38,
               (iterator)
               local_7c38.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish,(int *)local_7b48);
  }
  else {
    *local_7c38.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
     _M_finish = 3;
    local_7c38.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = local_7c38.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish + 1;
  }
  local_7be8 = linb::any::vtable_for_type<decltype(nullptr)>()::table;
  local_7bf8.dynamic = (void *)0x0;
  local_7be0 = 0;
  local_7bd8._0_8_ = (pointer)0x0;
  local_7bd8[8] = 0;
  local_7bd8._9_7_ = 0;
  local_7bd8[0x10] = 0;
  local_7bd8._17_8_ = 0;
  linb::any::operator=((any *)&local_7bf8,&local_7c38);
  tinyusdz::Attribute::set_var((Attribute *)&local_6cc0,(PrimVar *)&local_7bf8);
  tinyusdz::Property::Property((Property *)local_7b48,(Attribute *)&local_6cc0,false);
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,tinyusdz::Property>,std::_Select1st<std::pair<std::__cxx11::string_const,tinyusdz::Property>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,tinyusdz::Property>>>
  ::_M_emplace_unique<char_const(&)[20],tinyusdz::Property&>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,tinyusdz::Property>,std::_Select1st<std::pair<std::__cxx11::string_const,tinyusdz::Property>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,tinyusdz::Property>>>
              *)(local_49a8 + 0x1970),(char (*) [20])"primvars:uv:indices",(Property *)local_7b48);
  local_7c00 = stage;
  tinyusdz::Property::~Property((Property *)local_7b48);
  std::
  vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
  ::~vector((vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
             *)local_7bd8);
  if (local_7be8 != (undefined1 *)0x0) {
    (**(code **)(local_7be8 + 0x20))(&local_7bf8);
    local_7be8 = (undefined1 *)0x0;
  }
  if (local_7c38.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_7c38.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_7c38.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_7c38.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  tinyusdz::AttrMetas::~AttrMetas(&AStack_6c20);
  std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::~vector
            ((vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)local_6c38);
  std::
  vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
  ::~vector((vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
             *)local_6c58);
  if (local_6c68 != (undefined1 *)0x0) {
    (**(code **)(local_6c68 + 0x20))(&local_6c78);
    local_6c68 = (undefined1 *)0x0;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(local_6ca0.
                  super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                  ._M_impl.super__Vector_impl_data._M_finish._1_7_,
                  local_6ca0.
                  super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                  ._M_impl.super__Vector_impl_data._M_finish._0_1_) != &local_6c88) {
    operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)CONCAT71(local_6ca0.
                                super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                                ._M_impl.super__Vector_impl_data._M_finish._1_7_,
                                local_6ca0.
                                super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                                ._M_impl.super__Vector_impl_data._M_finish._0_1_),
                    CONCAT71(local_6c88._M_allocated_capacity._1_7_,local_6c88._M_local_buf[0]) + 1)
    ;
  }
  if ((undefined1 **)local_6cc0.dynamic != &local_6cb0) {
    operator_delete(local_6cc0.dynamic,(ulong)(local_6cb0 + 1));
  }
  tinyusdz::Property::~Property((Property *)local_72b8);
  tinyusdz::AttrMetas::~AttrMetas(&local_6a18);
  if (local_7c18.
      super__Vector_base<tinyusdz::value::texcoord2f,_std::allocator<tinyusdz::value::texcoord2f>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_7c18.
                    super__Vector_base<tinyusdz::value::texcoord2f,_std::allocator<tinyusdz::value::texcoord2f>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_7c18.
                          super__Vector_base<tinyusdz::value::texcoord2f,_std::allocator<tinyusdz::value::texcoord2f>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_7c18.
                          super__Vector_base<tinyusdz::value::texcoord2f,_std::allocator<tinyusdz::value::texcoord2f>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  tinyusdz::AttrMetas::~AttrMetas((AttrMetas *)&sStack_74c8);
  std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::~vector
            ((vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)local_74e0);
  std::
  vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
  ::~vector(&local_7500);
  if ((anon_struct_8_0_00000001_for___align)local_7510[0] !=
      (anon_struct_8_0_00000001_for___align)0x0) {
    (**(_func_void_storage_union_ptr **)((long)local_7510[0] + 0x20))(&sStack_7520);
    local_7510[0] = (undefined1 *)0x0;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_7568._40_8_ != &aStack_7530) {
    operator_delete((void *)local_7568._40_8_,aStack_7530._M_allocated_capacity + 1);
  }
  if (local_7568._0_8_ != (long)local_7568 + 0x10) {
    operator_delete((void *)local_7568._0_8_,local_7568._16_8_ + 1);
  }
  local_7b48._0_8_ = local_7b48 + 0x10;
  local_7b48._8_8_ = (pointer)0x0;
  local_7b38._M_allocated_capacity = local_7b38._M_allocated_capacity & 0xffffffffffffff00;
  local_7b28 = Varying;
  local_7b24 = false;
  local_7b18._0_8_ = 0;
  local_7b18[8] = '\0';
  local_7af0 = linb::any::vtable_for_type<decltype(nullptr)>()::table;
  local_7b00.dynamic = (void *)0x0;
  local_7ae8 = false;
  local_7ae0._0_8_ = (pointer)0x0;
  local_7ae0[8] = '\0';
  local_7ae0._9_7_ = 0;
  local_7ae0[0x10] = '\0';
  uStack_7acf = 0;
  local_7aa4 = (storage_t<tinyusdz::Interpolation>)0x0;
  local_7aa0 = false;
  local_7a9c = (storage_t<unsigned_int>)0x0;
  local_7a98._M_local_buf[0] = false;
  local_7a98._M_local_buf[1] = (char)(storage_t<bool>)0x0;
  local_7a98._M_local_buf[8] = false;
  local_7a18 = (storage_t<double>)0x0;
  local_7a10 = false;
  local_7908._16_8_ = 0;
  local_7908._24_8_ = 0;
  local_7908._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
  local_7908._8_8_ = 0;
  local_78e0._16_8_ = local_78e0;
  local_78e0._0_4_ = _S_red;
  local_78e0._8_8_ = (_Base_ptr)0x0;
  local_7a88._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
  local_7a88._8_8_ = 0;
  local_7a88._16_8_ = 0;
  local_7a88._24_8_ = 0;
  local_7a88._32_8_ = 0;
  local_7a88._40_8_ = 0;
  local_7a58 = false;
  aStack_7a28._M_local_buf[8] = false;
  local_7a50._32_8_ = 0;
  aStack_7a28._M_allocated_capacity = 0;
  local_7a50._16_8_ = 0;
  local_7a50._24_8_ = 0;
  local_7a50._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
  local_7a50._8_8_ = 0;
  local_79e8[0] = false;
  local_7a08._16_8_ = 0;
  local_7a08._24_8_ = 0;
  local_7a08.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
  local_7a08._8_8_ = 0;
  local_79e8._8_8_ = (anon_struct_8_0_00000001_for___align)0x0;
  local_79e8._16_8_ = 0;
  local_79e8._24_8_ = 0;
  aStack_79c8._M_allocated_capacity = 0;
  aStack_79c8._M_local_buf[8] = false;
  local_7998[0] = false;
  local_79b8._16_8_ = 0;
  local_79b8._24_8_ = 0;
  local_79b8.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
  local_79b8._8_8_ = 0;
  local_7960 = false;
  aStack_7978._8_8_ = 0;
  uStack_7968 = 0;
  local_7998._24_8_ = 0;
  aStack_7978._M_allocated_capacity = 0;
  local_7998._8_8_ = (anon_struct_8_0_00000001_for___align)0x0;
  local_7998._16_8_ = 0;
  local_7938[0] = false;
  local_7958._16_8_ = 0;
  local_7958._24_8_ = 0;
  local_7958.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
  local_7958._8_8_ = 0;
  aStack_7918._M_local_buf[8] = false;
  local_7938._24_8_ = 0;
  aStack_7918._M_allocated_capacity = 0;
  local_7938._8_8_ = (anon_struct_8_0_00000001_for___align)0x0;
  local_7938._16_8_ = 0;
  local_7ac0[0x10] = '\0';
  auStack_7aaf._0_8_ = 0;
  local_7ac0._0_8_ = (pointer)0x0;
  local_7ac0[8] = '\0';
  local_7ac0._9_7_ = 0;
  local_78b0.dynamic = (pointer)0x0;
  local_78b0._8_8_ = (pointer)0x0;
  local_78e0._32_8_ = 0;
  pSStack_78b8 = (pointer)0x0;
  local_6a18.interpolation.has_value_ = false;
  local_6a18.interpolation._1_3_ = 0;
  local_6a18.interpolation.contained = (storage_t<tinyusdz::Interpolation>)0x40080000;
  local_6cb0 = linb::any::vtable_for_type<decltype(nullptr)>()::table;
  local_6cc0.dynamic = (void *)0x0;
  local_6ca8 = 0;
  local_6ca0.
  super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_6ca0.
  super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
  ._M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
  local_6ca0.
  super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
  ._M_impl.super__Vector_impl_data._M_finish._1_7_ = 0;
  local_6ca0.
  super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
  local_6ca0.
  super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._1_7_ = 0;
  local_6c88._M_local_buf[0] = '\0';
  local_7b20._M_p = local_7b18 + 8;
  local_78e0._24_8_ = local_78e0._16_8_;
  linb::any::operator=((any *)&local_6cc0,(double *)&local_6a18);
  tinyusdz::Attribute::set_var((Attribute *)local_7b48,(PrimVar *)&local_6cc0);
  local_7b28 = Uniform;
  local_73a0[2] = local_73a0;
  local_7568._0_8_ = ((ulong)local_7568._0_8_ >> 8 & 0xffffff) << 8;
  local_7568._8_8_ = ((ulong)local_7568._8_8_ >> 8 & 0xffffff) << 8;
  local_7568[0x18] = '\0';
  local_74e0[8] = 0;
  local_74e0._9_7_ = 0;
  local_74e0[0x10] = false;
  local_73c8._0_8_ = 0;
  local_73c8._8_8_ = 0;
  local_73c8._16_8_ = 0;
  local_73c8._24_8_ = (anon_struct_8_0_00000001_for___align)0x0;
  local_73a0[0] = local_73a0[0] & 0xffffffff00000000;
  local_73a0[1] = 0;
  local_7568._32_8_ = (anon_struct_8_0_00000001_for___align)0x0;
  local_7568._40_8_ = (pointer)0x0;
  local_7568._48_8_ = 0;
  aStack_7530._M_allocated_capacity = 0;
  aStack_7530._8_8_ = 0;
  sStack_7520.dynamic = (void *)0x0;
  sStack_7520._8_1_ = 0;
  local_7510[0] = (undefined1 *)0x0;
  local_7510[1] = (undefined1 *)0x0;
  local_7500.
  super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_7500.
  super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
  ._M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
  local_7500.
  super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
  ._M_impl.super__Vector_impl_data._M_finish._1_7_ = 0;
  local_7500.
  super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
  local_7500.
  super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._1_7_ = 0;
  uStack_74e8 = false;
  uStack_74e7 = 0;
  local_74e0._0_8_ = local_74e0._0_8_ & 0xffffffffffffff00;
  local_74a8._0_8_ = local_74a8._0_8_ & 0xffffffffffffff00;
  sStack_74c8._16_8_ = 0;
  sStack_74c8._24_8_ = 0;
  sStack_74c8._0_4_ = 0;
  sStack_74c8._4_4_ = (storage_t<tinyusdz::Interpolation>)0x0;
  sStack_74c8._8_1_ = false;
  sStack_74c8._9_3_ = 0;
  sStack_74c8._12_4_ = (storage_t<unsigned_int>)0x0;
  local_74a8._40_8_ = local_74a8._40_8_ & 0xffffffffffffff00;
  local_74a8._24_8_ = 0;
  local_74a8._32_8_ = 0;
  local_74a8._8_8_ = (anon_struct_8_0_00000001_for___align)0x0;
  local_74a8._16_8_ = 0;
  local_7478._32_8_ = local_7478._32_8_ & 0xffffffffffffff00;
  local_7478._16_8_ = 0;
  local_7478._24_8_ = 0;
  local_7478._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
  local_7478._8_8_ = (anon_struct_8_0_00000001_for___align)0x0;
  local_7450._48_8_ = local_7450._48_8_ & 0xffffffffffffff00;
  local_7450._32_8_ = 0;
  local_7450._40_8_ = (anon_struct_8_0_00000001_for___align)0x0;
  local_7450._16_8_ = 0;
  local_7450._24_8_ = (storage_t<double>)0x0;
  local_7450._0_8_ = 0;
  local_7450._8_8_ = 0;
  local_7418._32_8_ = local_7418._32_8_ & 0xffffffffffffff00;
  local_7418._16_8_ = 0;
  local_7418._24_8_ = (anon_struct_8_0_00000001_for___align)0x0;
  local_7418._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
  local_7418._8_8_ = 0;
  local_73f0._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
  local_73f0._8_8_ = 0;
  local_73f0._16_8_ = 0;
  local_73f0._24_8_ = (anon_struct_8_0_00000001_for___align)0x0;
  local_73f0._32_8_ = local_73f0._32_8_ & 0xffffffffffffff00;
  sStack_7378._8_8_ = 0;
  sStack_7378._16_8_ = 0;
  local_7380 = 0;
  sStack_7378.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
  local_7568._17_7_ = SUB87(local_7568._16_8_,1) & 0xffffffffffff00;
  local_7568[0x10] = 1;
  local_73a0[3] = local_73a0[2];
  tinyusdz::AttrMetas::operator=((AttrMetas *)(auStack_7aaf + 7),(AttrMetas *)local_7568);
  tinyusdz::Property::Property((Property *)local_72b8,(Attribute *)local_7b48,true);
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,tinyusdz::Property>,std::_Select1st<std::pair<std::__cxx11::string_const,tinyusdz::Property>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,tinyusdz::Property>>>
  ::_M_emplace_unique<char_const(&)[8],tinyusdz::Property&>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,tinyusdz::Property>,std::_Select1st<std::pair<std::__cxx11::string_const,tinyusdz::Property>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,tinyusdz::Property>>>
              *)(local_49a8 + 0x1970),(char (*) [8])"myvalue",(Property *)local_72b8);
  tinyusdz::Property::~Property((Property *)local_72b8);
  tinyusdz::AttrMetas::~AttrMetas((AttrMetas *)local_7568);
  std::
  vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
  ::~vector(&local_6ca0);
  if (local_6cb0 != (undefined1 *)0x0) {
    (**(code **)(local_6cb0 + 0x20))(&local_6cc0);
    local_6cb0 = (undefined1 *)0x0;
  }
  tinyusdz::AttrMetas::~AttrMetas((AttrMetas *)(auStack_7aaf + 7));
  std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::~vector
            ((vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)local_7ac0);
  std::
  vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
  ::~vector((vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
             *)local_7ae0);
  if ((vtable_type *)local_7af0 != (vtable_type *)0x0) {
    (**(_func_void_storage_union_ptr **)((long)local_7af0 + 0x20))(&local_7b00);
    local_7af0 = (undefined1 *)0x0;
  }
  this = local_7c00;
  if (local_7b20._M_p != local_7b18 + 8) {
    operator_delete(local_7b20._M_p,CONCAT71(local_7b18._9_7_,local_7b18[8]) + 1);
  }
  if ((pointer)local_7b48._0_8_ != (pointer)(local_7b48 + 0x10)) {
    operator_delete((void *)local_7b48._0_8_,(ulong)(local_7b38._M_allocated_capacity + 1));
  }
  tinyusdz::Prim::Prim<tinyusdz::GeomMesh>((Prim *)local_72b8,(GeomMesh *)local_49a8);
  tinyusdz::Prim::Prim<tinyusdz::Xform>((Prim *)local_7b48,(Xform *)&local_6810);
  std::vector<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>::emplace_back<tinyusdz::Prim>
            (local_7898,(Prim *)local_72b8);
  std::vector<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>::emplace_back<tinyusdz::Prim>
            (&this->_root_nodes,(Prim *)local_7b48);
  tinyusdz::Prim::~Prim((Prim *)local_7b48);
  tinyusdz::Prim::~Prim((Prim *)local_72b8);
  tinyusdz::GeomMesh::~GeomMesh((GeomMesh *)local_49a8);
  std::
  vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
  ::~vector(&local_7bb8._var._ts._samples);
  if (local_7bb8._var._value.v_.vtable != (vtable_type *)0x0) {
    (*(local_7bb8._var._value.v_.vtable)->destroy)((storage_union *)&local_7bb8._var);
    local_7bb8._var._value.v_.vtable = (vtable_type *)0x0;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_7bb8.suffix._M_dataplus._M_p != &local_7bb8.suffix.field_2) {
    operator_delete(local_7bb8.suffix._M_dataplus._M_p,
                    CONCAT71(local_7bb8.suffix.field_2._M_allocated_capacity._1_7_,
                             local_7bb8.suffix.field_2._M_local_buf[0]) + 1);
  }
  tinyusdz::GPrim::~GPrim(&local_6810);
  return;
}

Assistant:

void SimpleScene(tinyusdz::Stage *stage)
{
  //
  // tinyusdz currently does not provide scene construction API yet, so edit parameters directly.
  //
  // TinyUSDZ does not use mutex, smart pointers(e.g. shared_ptr) and C++ exception.
  // API is not multi-thread safe, thus if you need to manipulate a scene in multi-threaded context,
  // The app must take care of resource locks in app layer.
  //
  tinyusdz::Xform xform;
  xform.name = "root";

  tinyusdz::XformOp op;
  op.op_type = tinyusdz::XformOp::OpType::Translate;
  tinyusdz::value::double3 translate;
  translate[0] = 1.0;
  translate[1] = 2.0;
  translate[2] = 3.0;
  op.set_value(translate);

  xform.xformOps.push_back(op);

  tinyusdz::GeomMesh mesh;
  mesh.name = "quad";

  {
    std::vector<tinyusdz::value::point3f> pts;
    pts.push_back({0.0f, 0.0f, 0.0f});

    pts.push_back({1.0f, 0.0f, 0.0f});

    pts.push_back({1.0f, 1.0f, 0.0f});

    pts.push_back({0.0f, 1.0f, 0.0f});

    mesh.points.set_value(pts);
  }

  {
    // quad plane composed of 2 triangles.
    std::vector<int> indices;
    std::vector<int> counts;
    counts.push_back(3);
    counts.push_back(3);
    mesh.faceVertexCounts.set_value(counts);

    indices.push_back(0);
    indices.push_back(1);
    indices.push_back(2);

    indices.push_back(0);
    indices.push_back(2);
    indices.push_back(3);

    mesh.faceVertexIndices.set_value(indices);
  }

  // primvar and custom attribute can be added to generic Property container `props`
  {
    // primvar is simply an attribute with prefix `primvars:`
    //
    // texCoord2f[] primvars:uv = [ ... ] ( interpolation = "vertex" )
    // int[] primvars:uv:indices = [ ... ]
    //
    {
      tinyusdz::Attribute uvAttr;
      std::vector<tinyusdz::value::texcoord2f> uvs;

      uvs.push_back({0.0f, 0.0f});
      uvs.push_back({1.0f, 0.0f});
      uvs.push_back({1.0f, 1.0f});
      uvs.push_back({0.0f, 1.0f});

      // Fast path. Set the value directly to Attribute.
      uvAttr.set_value(uvs);

      // or we can first build primvar::PrimVar
      //tinyusdz::primvar::PrimVar uvVar;
      //uvVar.set_value(uvs);
      //uvAttr.set_var(std::move(uvVar));

      // Currently `interpolation` is described in Attribute metadataum.
      tinyusdz::AttrMeta meta;
      meta.interpolation = tinyusdz::Interpolation::Vertex;
      uvAttr.metas() = meta;

      tinyusdz::Property uvProp(uvAttr, /* custom*/false);

      mesh.props.emplace("primvars:uv", uvProp);

      // ----------------------

      tinyusdz::Attribute uvIndexAttr;
      std::vector<int> uvIndices;

      // FIXME: Validate
      uvIndices.push_back(0);
      uvIndices.push_back(1);
      uvIndices.push_back(2);
      uvIndices.push_back(3);


      tinyusdz::primvar::PrimVar uvIndexVar;
      uvIndexVar.set_value(uvIndices);
      uvIndexAttr.set_var(std::move(uvIndexVar));

      tinyusdz::Property uvIndexProp(uvIndexAttr, /* custom*/false);
      mesh.props.emplace("primvars:uv:indices", uvIndexProp);

    }

    // `custom uniform double myvalue = 3.0 ( hidden = 0 )`
    {
      tinyusdz::Attribute attrib;
      double myvalue = 3.0;
      tinyusdz::primvar::PrimVar var;
      var.set_value(myvalue);
      attrib.set_var(std::move(var));

      attrib.variability() = tinyusdz::Variability::Uniform;

      tinyusdz::AttrMeta meta;
      meta.hidden = false;
      attrib.metas() = meta;

      tinyusdz::Property prop(attrib, /* custom*/true);

      mesh.props.emplace("myvalue", prop);
    }

  }

  tinyusdz::Prim meshPrim(mesh);
  tinyusdz::Prim xformPrim(xform);

  // [Xform]
  //  |
  //  +- [Mesh]
  //
  xformPrim.children().emplace_back(std::move(meshPrim));

  stage->root_prims().emplace_back(std::move(xformPrim));
}